

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O1

void __thiscall
Js::JavascriptWeakMap::ExtractSnapObjectDataInto
          (JavascriptWeakMap *this,SnapObject *objData,SlabAllocator *alloc)

{
  int iVar1;
  RecyclableObject *key;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  void **ppvVar6;
  undefined4 *puVar7;
  WeakMapKeyMap *this_00;
  Var pvVar8;
  JavascriptWeakMap *this_01;
  int last;
  int i;
  void *local_90;
  void *local_88;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *local_80;
  Var local_78;
  SnapObject *local_70;
  Var local_68;
  Var value;
  SlabAllocator *local_58;
  ulong local_50;
  uint *local_48;
  ulong local_40;
  JavascriptWeakMap *local_38;
  
  local_70 = objData;
  puVar5 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  local_80 = &(this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ;
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  uVar4 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  local_40 = (ulong)uVar4;
  *puVar5 = 0;
  local_50 = (ulong)(uVar4 * 2 + 1);
  local_58 = alloc;
  ppvVar6 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,local_50);
  *(void ***)(puVar5 + 2) = ppvVar6;
  local_48 = puVar5;
  if ((this->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0) {
    local_40 = (ulong)(uint)((int)local_40 * 2);
    local_88 = (void *)((ulong)this | 1);
    local_38 = this;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pvVar8 = (Var)0x0;
    this_01 = local_38;
    do {
      i = (this_01->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[(long)pvVar8];
      value = pvVar8;
      if (i != -1) {
        last = -1;
        do {
          key = (this_01->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .weakRefs.ptr[i].ptr;
          if (key == (RecyclableObject *)0x0) {
            iVar1 = (this_01->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(local_80,i,last,(uint)value);
          }
          else {
            local_68 = (Var)0x0;
            this_00 = GetWeakMapKeyMapFromKey(this_01,key);
            if (this_00 != (WeakMapKeyMap *)0x0) {
              local_90 = local_88;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey(this_00,&local_90);
              if (bVar3) {
                KeyMapGet(local_38,this_00,&local_68);
                pvVar8 = local_68;
                if ((uint)local_40 <= *local_48 + 1) {
                  local_78 = local_68;
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar7 = 1;
                  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                              ,0x1a0,"(smi->MapSize + 1 < mapCountEst)",
                                              "We are writing junk");
                  if (!bVar3) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  *puVar7 = 0;
                  pvVar8 = local_78;
                }
                uVar4 = *local_48;
                *(RecyclableObject **)(*(long *)(local_48 + 2) + (ulong)uVar4 * 8) = key;
                *(Var *)(*(long *)(local_48 + 2) + (ulong)(uVar4 + 1) * 8) = pvVar8;
                *local_48 = uVar4 + 2;
              }
            }
            iVar1 = (local_38->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            last = i;
          }
          i = iVar1;
          this_01 = local_38;
        } while (i != -1);
      }
      pvVar8 = (Var)((long)value + 1);
    } while (pvVar8 < (Var)(ulong)(this_01->keySet).
                                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                  .bucketCount);
  }
  puVar5 = local_48;
  if ((ulong)*local_48 == 0) {
    local_48[2] = 0;
    local_48[3] = 0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>(local_58,local_50);
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>(local_58,(ulong)*local_48,local_50);
  }
  if (local_70->SnapObjectTag != SnapMapObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  local_70->AddtlSnapObjectInfo = puVar5;
  return;
}

Assistant:

void JavascriptWeakMap::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapMapInfo* smi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>();
        uint32 mapCountEst = this->Size() * 2;

        smi->MapSize = 0;
        smi->MapKeyValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(mapCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            AssertMsg(smi->MapSize + 1 < mapCountEst, "We are writing junk");

            smi->MapKeyValueArray[smi->MapSize] = key;
            smi->MapKeyValueArray[smi->MapSize + 1] = value;
            smi->MapSize += 2;
        });

        if(smi->MapSize == 0)
        {
            smi->MapKeyValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(mapCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(smi->MapSize, mapCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapMapInfo*, TTD::NSSnapObjects::SnapObjectType::SnapMapObject>(objData, smi);
    }